

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPolComponent_VectorImplementation.cpp
# Opt level: O1

Index __thiscall
JPolComponent_VectorImplementation::GetJointActionIndex
          (JPolComponent_VectorImplementation *this,Index jdI)

{
  PolicyPureVector *pPVar1;
  int iVar2;
  Index IVar3;
  uint uVar4;
  undefined4 extraout_var;
  pointer ppPVar5;
  undefined4 extraout_var_00;
  ostream *poVar6;
  undefined8 *puVar7;
  uint uVar8;
  Interface_ProblemToPolicyDiscretePure *pIVar9;
  size_type __n;
  ulong uVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> individualDomainIndices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> individualActionIndices;
  allocator_type local_1c1;
  void *local_1c0;
  void *local_1b8;
  long local_1b0;
  undefined1 local_1a8 [16];
  pointer local_198;
  
  pIVar9 = this->_m_PTPDP;
  if (pIVar9 == (Interface_ProblemToPolicyDiscretePure *)0x0) {
    pIVar9 = (this->_m_PTPDPshared).px;
  }
  iVar2 = (*(pIVar9->super_Interface_ProblemToPolicyDiscrete).
            _vptr_Interface_ProblemToPolicyDiscrete[2])(pIVar9,(ulong)this->_m_idc);
  if ((char)iVar2 != '\0') {
    pIVar9 = this->_m_PTPDP;
    if (pIVar9 == (Interface_ProblemToPolicyDiscretePure *)0x0) {
      pIVar9 = (this->_m_PTPDPshared).px;
    }
    iVar2 = (*(pIVar9->super_Interface_ProblemToPolicyDiscrete).
              _vptr_Interface_ProblemToPolicyDiscrete[10])(pIVar9,jdI,(ulong)this->_m_idc);
    ppPVar5 = (this->_m_indivPols_PolicyPureVector).
              super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->_m_indivPols_PolicyPureVector).
        super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppPVar5) {
      uVar8 = 1;
      uVar10 = 0;
      do {
        IVar3 = (**(code **)(*(long *)ppPVar5[uVar10] + 0x40))
                          (ppPVar5[uVar10],
                           *(undefined4 *)(*(long *)CONCAT44(extraout_var,iVar2) + uVar10 * 4));
        this->_m_indivActionIndices[uVar10] = IVar3;
        uVar10 = (ulong)uVar8;
        ppPVar5 = (this->_m_indivPols_PolicyPureVector).
                  super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar8 = uVar8 + 1;
      } while (uVar10 < (ulong)((long)(this->_m_indivPols_PolicyPureVector).
                                      super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar5 >>
                               3));
    }
    pIVar9 = this->_m_PTPDP;
    if (pIVar9 == (Interface_ProblemToPolicyDiscretePure *)0x0) {
      pIVar9 = (this->_m_PTPDPshared).px;
    }
    IVar3 = (*(pIVar9->super_Interface_ProblemToPolicyDiscrete).
              _vptr_Interface_ProblemToPolicyDiscrete[6])(pIVar9,this->_m_indivActionIndices);
    return IVar3;
  }
  pIVar9 = this->_m_PTPDP;
  if (pIVar9 == (Interface_ProblemToPolicyDiscretePure *)0x0) {
    pIVar9 = (this->_m_PTPDPshared).px;
  }
  (*(pIVar9->super_Interface_ProblemToPolicyDiscrete)._vptr_Interface_ProblemToPolicyDiscrete[9])
            (&local_1c0,pIVar9,jdI,(ulong)this->_m_idc);
  pIVar9 = this->_m_PTPDP;
  if (pIVar9 == (Interface_ProblemToPolicyDiscretePure *)0x0) {
    pIVar9 = (this->_m_PTPDPshared).px;
  }
  iVar2 = (*(pIVar9->super_Interface_ProblemToPolicyDiscrete).
            _vptr_Interface_ProblemToPolicyDiscrete[3])();
  __n = (long)local_1b8 - (long)local_1c0 >> 2;
  if (__n == CONCAT44(extraout_var_00,iVar2)) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1a8,__n,&local_1c1);
    if (local_1b8 != local_1c0) {
      uVar8 = 1;
      uVar10 = 0;
      do {
        pPVar1 = (this->_m_indivPols_PolicyPureVector).
                 super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar10];
        uVar4 = (**(code **)(*(long *)pPVar1 + 0x40))
                          (pPVar1,*(undefined4 *)((long)local_1c0 + uVar10 * 4));
        *(uint *)(local_1a8._0_8_ + uVar10 * 4) = uVar4;
        uVar10 = (ulong)uVar8;
        uVar8 = uVar8 + 1;
      } while (uVar10 < (ulong)((long)local_1b8 - (long)local_1c0 >> 2));
    }
    pIVar9 = this->_m_PTPDP;
    if (pIVar9 == (Interface_ProblemToPolicyDiscretePure *)0x0) {
      pIVar9 = (this->_m_PTPDPshared).px;
    }
    IVar3 = (*(pIVar9->super_Interface_ProblemToPolicyDiscrete).
              _vptr_Interface_ProblemToPolicyDiscrete[7])(pIVar9,local_1a8);
    if ((pointer)local_1a8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1a8._0_8_,(long)local_198 - local_1a8._0_8_);
    }
    if (local_1c0 != (void *)0x0) {
      operator_delete(local_1c0,local_1b0 - (long)local_1c0);
    }
    return IVar3;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,
             " JPolComponent_VectorImplementation::GetJointActionIndex Dimension ",0x43);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,"mismatch, jdI has ",0x12);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"individual actions, but there are ",0x22);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," agents!\n",9);
  puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar7 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar7,&E::typeinfo,E::~E);
}

Assistant:

Index JPolComponent_VectorImplementation::GetJointActionIndex(Index jdI) const
{
    Index ohI, aThisAgent, ja_i;

    // it is possible to cache the joint->individual observ. history mapping
    // If this is done we want to use it by calling 
    //    JointToIndividualObservationHistoryIndicesRef
    // as it is faster.
    // Otherwise we have to use 
    //    JointToIndividualObservationHistoryIndices
    // to avoid a segfault.
    //
    // The mentioned cache is calculated, when generating joint observation
    // histories. This is controlled by the 
    // PlanningUnitMADPDiscreteParameters of the PlanningUnitMADPDiscrete.
    // ( _m_params.GetComputeJointObservationHistories() in particular )

    //if the "Interface_ProblemToPolicyDiscretePure"-implementing object this
    //policy caches joint -> indiv OH indices
    if(GetInterfacePTPDiscretePure()->AreCachedJointToIndivIndices(_m_idc ) )
    {
        const vector<Index> &individualDomainIndices = GetInterfacePTPDiscretePure()->
            JointToIndividualPolicyDomainIndicesRef(jdI, _m_idc );

        //vector<Index> individualActionIndices(individualDomainIndices.size());
        for( Index agentI=0; agentI < _m_indivPols_PolicyPureVector.size() ;  agentI++ )
        {
            ohI=individualDomainIndices[agentI];
            aThisAgent = _m_indivPols_PolicyPureVector[agentI]->
                GetActionIndex(ohI);

            _m_indivActionIndices[agentI]=aThisAgent;
        }
        ja_i = GetInterfacePTPDiscretePure()->IndividualToJointActionIndices(_m_indivActionIndices);
    } 
    else 
    { 
        vector<Index> individualDomainIndices = GetInterfacePTPDiscretePure()->
            JointToIndividualPolicyDomainIndices(jdI,_m_idc);

        size_t nrA = GetInterfacePTPDiscretePure()->GetNrAgents(); 
        if( individualDomainIndices.size() !=
            static_cast<vector<Index>::size_type>(nrA)   ) 
        {
            stringstream ss; 
            ss<<" JPolComponent_VectorImplementation::GetJointActionIndex Dimension "<<
                "mismatch, jdI has " << individualDomainIndices.size() <<
                "individual actions, but there are "<< nrA <<" agents!\n"; 
            throw E(ss); 
        }

        vector<Index> individualActionIndices(individualDomainIndices.size());
        for( Index agentI=0; agentI < individualDomainIndices.size();
             ++agentI )
        {
            ohI=individualDomainIndices[agentI];
            aThisAgent = _m_indivPols_PolicyPureVector[agentI]->GetActionIndex(ohI);
            individualActionIndices[agentI]=aThisAgent;
        }

        ja_i = GetInterfacePTPDiscretePure()->IndividualToJointActionIndices(
            individualActionIndices);

    }

    return(ja_i);
}